

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

void Gia_ManCollectTfo_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  int local_2c;
  int iFan;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsCo(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                      ,0x262,"void Gia_ManCollectTfo_rec(Gia_Man_t *, int, Vec_Int_t *)");
      }
      for (local_2c = 0; iVar1 = Gia_ObjFanoutNumId(p,iObj), local_2c < iVar1;
          local_2c = local_2c + 1) {
        iVar1 = Gia_ObjFanoutId(p,iObj,local_2c);
        Gia_ManCollectTfo_rec(p,iVar1,vNodes);
      }
      Vec_IntPush(vNodes,iObj);
    }
  }
  return;
}

Assistant:

void Gia_ManCollectTfo_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj; int i, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCo(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        Gia_ManCollectTfo_rec( p, iFan, vNodes );
    Vec_IntPush( vNodes, iObj );
}